

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O0

void ndn_pit_unregister_face(ndn_pit_t *self,ndn_table_id_t face_id)

{
  ndn_nametree_t *pnVar1;
  ushort local_14;
  ndn_table_id_t i;
  ndn_table_id_t face_id_local;
  ndn_pit_t *self_local;
  
  for (local_14 = 0; local_14 < self->capacity; local_14 = local_14 + 1) {
    pnVar1 = (ndn_nametree_t *)
             bitset_unset((ndn_bitset_t)self[(ulong)local_14 * 5 + 2].nametree,(ulong)face_id);
    self[(ulong)local_14 * 5 + 2].nametree = pnVar1;
    ndn_pit_remove_entry_if_empty(self,(ndn_pit_entry_t *)(self + (ulong)local_14 * 5 + 1));
  }
  return;
}

Assistant:

void
ndn_pit_unregister_face(ndn_pit_t* self, ndn_table_id_t face_id){
  for (ndn_table_id_t i = 0; i < self->capacity; ++i){
    self->slots[i].incoming_faces = bitset_unset(self->slots[i].incoming_faces, face_id);
    ndn_pit_remove_entry_if_empty(self, &self->slots[i]);
  }
}